

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O0

int __thiscall crnd::crn_unpacker::init(crn_unpacker *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  crn_header *pcVar2;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  uint32 in_EDX;
  uint32 data_size_local;
  void *pData_local;
  crn_unpacker *this_local;
  crn_unpacker *pcVar3;
  
  pcVar2 = crnd_get_header(ctx,in_EDX);
  this->m_pHeader = pcVar2;
  if (this->m_pHeader == (crn_header *)0x0) {
    this_local._7_1_ = 0;
    pcVar3 = this;
  }
  else {
    this->m_pData = (uint8 *)ctx;
    this->m_data_size = in_EDX;
    bVar1 = init_tables(this);
    pcVar3 = (crn_unpacker *)CONCAT71(extraout_var,bVar1);
    if (bVar1) {
      bVar1 = decode_palettes(this);
      pcVar3 = (crn_unpacker *)CONCAT71(extraout_var_00,bVar1);
      if (bVar1) {
        this_local._7_1_ = 1;
      }
      else {
        this_local._7_1_ = 0;
      }
    }
    else {
      this_local._7_1_ = 0;
    }
  }
  return (int)CONCAT71((int7)((ulong)pcVar3 >> 8),this_local._7_1_);
}

Assistant:

bool init(const void* pData, uint32 data_size)
        {
            m_pHeader = crnd_get_header(pData, data_size);
            if (!m_pHeader)
                return false;

            m_pData = static_cast<const uint8*>(pData);
            m_data_size = data_size;

            if (!init_tables())
                return false;

            if (!decode_palettes())
                return false;

            return true;
        }